

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.h
# Opt level: O0

bitwidth_t __thiscall slang::SVInt::getActiveBits(SVInt *this)

{
  int iVar1;
  bitwidth_t bVar2;
  long in_RDI;
  SVInt *in_stack_ffffffffffffffe8;
  
  iVar1 = *(int *)(in_RDI + 8);
  bVar2 = countLeadingZeros(in_stack_ffffffffffffffe8);
  return iVar1 - bVar2;
}

Assistant:

bitwidth_t getActiveBits() const { return bitWidth - countLeadingZeros(); }